

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS ref_clump_around(REF_GRID_conflict ref_grid,REF_INT node,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_GRID_conflict pRVar4;
  uint uVar5;
  FILE *__s;
  undefined8 uVar6;
  ulong uVar7;
  int node_00;
  char *pcVar8;
  REF_INT RVar9;
  long lVar10;
  ulong uVar11;
  REF_DICT node_dict;
  REF_DICT local_e0;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  uint local_c4;
  REF_GRID_conflict local_c0;
  ulong local_b8;
  char *local_b0;
  REF_INT nodes [27];
  
  uVar7 = (ulong)(uint)node;
  uVar5 = ref_dict_create(&node_dict);
  if (uVar5 == 0) {
    uVar5 = ref_dict_create(&tri_dict);
    if (uVar5 == 0) {
      uVar5 = ref_dict_create(&tet_dict);
      if (uVar5 == 0) {
        pRVar1 = ref_grid->cell[3];
        uVar11 = 0xffffffff;
        RVar9 = -1;
        if (-1 < node) {
          pRVar2 = pRVar1->ref_adj;
          uVar11 = 0xffffffff;
          RVar9 = -1;
          if (node < pRVar2->nnode) {
            uVar5 = pRVar2->first[uVar7];
            uVar11 = 0xffffffff;
            RVar9 = -1;
            if ((long)(int)uVar5 != -1) {
              RVar9 = pRVar2->item[(int)uVar5].ref;
              uVar11 = (ulong)uVar5;
            }
          }
        }
        local_e0 = tri_dict;
        local_c4 = node;
        local_c0 = ref_grid;
        local_b8 = uVar7;
        local_b0 = filename;
        while ((int)uVar11 != -1) {
          uVar5 = ref_cell_nodes(pRVar1,RVar9,nodes);
          if (uVar5 != 0) {
            uVar7 = (ulong)uVar5;
            pcVar8 = "n";
            uVar6 = 0x8c;
            goto LAB_001cfc50;
          }
          uVar5 = ref_dict_store(local_e0,RVar9,0);
          if (uVar5 != 0) {
            uVar7 = (ulong)uVar5;
            pcVar8 = "store";
            uVar6 = 0x8d;
            goto LAB_001cfc50;
          }
          lVar10 = 0;
          while (lVar10 < pRVar1->node_per) {
            uVar5 = ref_dict_store(node_dict,nodes[lVar10],0);
            lVar10 = lVar10 + 1;
            if (uVar5 != 0) {
              uVar7 = (ulong)uVar5;
              pcVar8 = "store";
              uVar6 = 0x8f;
              goto LAB_001cfc50;
            }
          }
          pRVar3 = pRVar1->ref_adj->item;
          uVar11 = (ulong)pRVar3[(int)uVar11].next;
          RVar9 = -1;
          uVar7 = (ulong)local_c4;
          if (uVar11 != 0xffffffffffffffff) {
            RVar9 = pRVar3[uVar11].ref;
          }
        }
        pRVar1 = local_c0->cell[8];
        uVar11 = 0xffffffff;
        RVar9 = -1;
        node_00 = (int)uVar7;
        if (-1 < node_00) {
          pRVar2 = pRVar1->ref_adj;
          uVar11 = 0xffffffff;
          RVar9 = -1;
          if (node_00 < pRVar2->nnode) {
            uVar5 = pRVar2->first[local_b8];
            uVar11 = 0xffffffff;
            RVar9 = -1;
            if ((long)(int)uVar5 != -1) {
              RVar9 = pRVar2->item[(int)uVar5].ref;
              uVar11 = (ulong)uVar5;
            }
          }
        }
        local_e0 = tet_dict;
        while( true ) {
          pcVar8 = local_b0;
          if ((int)uVar11 == -1) break;
          uVar5 = ref_cell_nodes(pRVar1,RVar9,nodes);
          if (uVar5 != 0) {
            uVar7 = (ulong)uVar5;
            pcVar8 = "n";
            uVar6 = 0x94;
            goto LAB_001cfc50;
          }
          uVar5 = ref_dict_store(local_e0,RVar9,0);
          if (uVar5 != 0) {
            uVar7 = (ulong)uVar5;
            pcVar8 = "store";
            uVar6 = 0x95;
            goto LAB_001cfc50;
          }
          lVar10 = 0;
          while (lVar10 < pRVar1->node_per) {
            uVar5 = ref_dict_store(node_dict,nodes[lVar10],0);
            lVar10 = lVar10 + 1;
            if (uVar5 != 0) {
              uVar7 = (ulong)uVar5;
              pcVar8 = "store";
              uVar6 = 0x97;
              goto LAB_001cfc50;
            }
          }
          pRVar3 = pRVar1->ref_adj->item;
          uVar11 = (ulong)pRVar3[(int)uVar11].next;
          RVar9 = -1;
          if (uVar11 != 0xffffffffffffffff) {
            RVar9 = pRVar3[uVar11].ref;
          }
        }
        __s = fopen(local_b0,"w");
        if (__s == (FILE *)0x0) {
          printf("unable to open %s\n",pcVar8);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x9c,"ref_clump_around","unable to open file");
          return 2;
        }
        fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
        fwrite("variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n",0x2b,1,__s);
        pRVar4 = local_c0;
        uVar5 = ref_clump_zone_around
                          ((FILE *)__s,local_c0->cell[3],tri_dict,"fetriangle",node_dict,
                           local_c0->node,node_00);
        if (uVar5 == 0) {
          uVar5 = ref_clump_zone_around
                            ((FILE *)__s,pRVar4->cell[8],tet_dict,"fetetrahedron",node_dict,
                             pRVar4->node,node_00);
          if (uVar5 == 0) {
            fclose(__s);
            uVar5 = ref_dict_free(tet_dict);
            if (uVar5 == 0) {
              uVar5 = ref_dict_free(tri_dict);
              if (uVar5 == 0) {
                uVar5 = ref_dict_free(node_dict);
                if (uVar5 == 0) {
                  return 0;
                }
                uVar7 = (ulong)uVar5;
                pcVar8 = "free nodes";
                uVar6 = 0xb3;
              }
              else {
                uVar7 = (ulong)uVar5;
                pcVar8 = "free tris";
                uVar6 = 0xb2;
              }
            }
            else {
              uVar7 = (ulong)uVar5;
              pcVar8 = "free tet";
              uVar6 = 0xb1;
            }
          }
          else {
            uVar7 = (ulong)uVar5;
            pcVar8 = "zone";
            uVar6 = 0xad;
          }
        }
        else {
          uVar7 = (ulong)uVar5;
          pcVar8 = "zone";
          uVar6 = 0xa6;
        }
      }
      else {
        uVar7 = (ulong)uVar5;
        pcVar8 = "create tets";
        uVar6 = 0x87;
      }
    }
    else {
      uVar7 = (ulong)uVar5;
      pcVar8 = "create tris";
      uVar6 = 0x86;
    }
  }
  else {
    uVar7 = (ulong)uVar5;
    pcVar8 = "create nodes";
    uVar6 = 0x85;
  }
LAB_001cfc50:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_around",uVar7,pcVar8);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_clump_around(REF_GRID ref_grid, REF_INT node,
                                    const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}